

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

shared_ptr<wallet::CWallet> __thiscall wallet::TestLoadWallet(wallet *this,WalletContext *context)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar1;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  DatabaseStatus status;
  bilingual_str error;
  long *local_100;
  allocator<char> local_f1;
  long *local_f0;
  vector<bilingual_str,_std::allocator<bilingual_str>_> local_e8;
  DatabaseStatus local_cc;
  string local_c8;
  bilingual_str local_a8;
  DatabaseOptions local_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.require_existing = false;
  local_68.require_create = false;
  local_68.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
  super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged = false;
  local_68.create_passphrase._M_dataplus._M_p = (pointer)&local_68.create_passphrase.field_2;
  local_68.create_passphrase._M_string_length = 0;
  local_68.create_passphrase.field_2._M_local_buf[0] = '\0';
  local_68.verify = true;
  local_68.use_unsafe_sync = false;
  local_a8.original._M_dataplus._M_p = (pointer)&local_a8.original.field_2;
  local_a8.original._M_string_length = 0;
  local_68.use_shared_memory = false;
  local_68.max_log_mb = 100;
  local_a8.original.field_2._M_local_buf[0] = '\0';
  local_a8.translated._M_dataplus._M_p = (pointer)&local_a8.translated.field_2;
  local_a8.translated._M_string_length = 0;
  local_68.create_flags = 0x400000000;
  local_a8.translated.field_2._M_local_buf[0] = '\0';
  local_e8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_f1);
  MakeWalletDatabase((wallet *)&local_f0,&local_c8,&local_68,&local_cc,&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  local_100 = local_f0;
  local_f0 = (long *)0x0;
  TestLoadWallet(this,(unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       )&local_100,context,local_68.create_flags);
  if (local_100 != (long *)0x0) {
    (**(code **)(*local_100 + 8))();
  }
  if (local_f0 != (long *)0x0) {
    (**(code **)(*local_f0 + 8))();
  }
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&local_e8);
  bilingual_str::~bilingual_str(&local_a8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::~basic_string
            (&local_68.create_passphrase);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    sVar1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<wallet::CWallet>)
           sVar1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> TestLoadWallet(WalletContext& context)
{
    DatabaseOptions options;
    options.create_flags = WALLET_FLAG_DESCRIPTORS;
    DatabaseStatus status;
    bilingual_str error;
    std::vector<bilingual_str> warnings;
    auto database = MakeWalletDatabase("", options, status, error);
    return TestLoadWallet(std::move(database), context, options.create_flags);
}